

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexPattern.cpp
# Opt level: O0

RegexPattern * __thiscall
UnifiedRegex::RegexPattern::CopyToScriptContext(RegexPattern *this,ScriptContext *scriptContext)

{
  Program **ppPVar1;
  RegexPattern *pattern;
  Matcher **ppMVar2;
  Matcher *this_00;
  Matcher *local_40;
  Matcher *matcherClone;
  RegexPattern *result;
  ScriptContext *scriptContext_local;
  RegexPattern *this_local;
  
  ppPVar1 = Memory::WriteBarrierPtr::operator_cast_to_Program__
                      ((WriteBarrierPtr *)&(this->rep).unified);
  pattern = New(scriptContext,*ppPVar1,(bool)(this->field_0x18 & 1));
  ppMVar2 = Memory::WriteBarrierPtr::operator_cast_to_Matcher__
                      ((WriteBarrierPtr *)&(this->rep).unified.matcher);
  if (*ppMVar2 == (Matcher *)0x0) {
    local_40 = (Matcher *)0x0;
  }
  else {
    this_00 = Memory::WriteBarrierPtr<UnifiedRegex::Matcher>::operator->
                        (&(this->rep).unified.matcher);
    local_40 = Matcher::CloneToScriptContext(this_00,scriptContext,pattern);
  }
  Memory::WriteBarrierPtr<UnifiedRegex::Matcher>::operator=
            (&(pattern->rep).unified.matcher,local_40);
  pattern->field_0x18 = pattern->field_0x18 & 0xfd | 2;
  return pattern;
}

Assistant:

RegexPattern *RegexPattern::CopyToScriptContext(Js::ScriptContext *scriptContext)
    {
        // This routine assumes that this instance will outlive the copy, which is the case for copy-on-write,
        // and therefore doesn't copy the immutable parts of the pattern. This should not be confused with a
        // would be CloneToScriptContext which will would clone the immutable parts as well because the lifetime
        // of a clone might be longer than the original.

        RegexPattern *result = UnifiedRegex::RegexPattern::New(scriptContext, rep.unified.program, isLiteral);
        Matcher *matcherClone = rep.unified.matcher ? rep.unified.matcher->CloneToScriptContext(scriptContext, result) : nullptr;
        result->rep.unified.matcher = matcherClone;
        result->isShallowClone = true;
        return result;
    }